

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatBuffer.h
# Opt level: O0

void __thiscall
slang::FormatBuffer::format<unsigned_long&>
          (FormatBuffer *this,text_style *style,format_string<unsigned_long_&> fmt,
          unsigned_long *args)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 ts;
  basic_format_args<fmt::v11::context> args_00;
  basic_string_view<char> fmt_00;
  format_args args_01;
  string_view fmt_01;
  long in_RDI;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R8;
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined1 *local_130;
  locale_ref local_110;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined1 *local_f0;
  undefined1 *local_b0;
  undefined8 *local_a8;
  undefined1 *local_a0;
  undefined8 *local_98;
  buffer<char> *in_stack_ffffffffffffff80;
  unsigned_long_long in_stack_ffffffffffffff88;
  buffer<char> *in_stack_ffffffffffffff98;
  locale_ref in_stack_ffffffffffffffa0;
  unsigned_long_long in_stack_ffffffffffffffa8;
  char *pcVar1;
  size_t in_stack_ffffffffffffffc0;
  
  if ((*(byte *)(in_RDI + 0x218) & 1) == 0) {
    pcVar1 = (char *)((in_R8.values_)->field_0).long_long_value;
    local_a8 = &local_f8;
    local_b0 = local_108;
    local_f8 = 4;
    local_f0 = local_b0;
    ::fmt::v11::detail::locale_ref::locale_ref(&local_110);
    fmt_01.size_ = in_stack_ffffffffffffffc0;
    fmt_01.data_ = pcVar1;
    args_01.field_1.args_ = in_R8.args_;
    args_01.desc_ = in_stack_ffffffffffffffa8;
    ::fmt::v11::detail::vformat_to
              (in_stack_ffffffffffffff98,fmt_01,args_01,in_stack_ffffffffffffffa0);
  }
  else {
    ts.values_ = (value<fmt::v11::context> *)((in_R8.values_)->field_0).named_args.data;
    local_98 = &local_138;
    local_a0 = local_148;
    local_138 = 4;
    fmt_00.size_ = (size_t)ts.values_;
    fmt_00.data_ = &stack0xffffffffffffff78;
    args_00.field_1.values_ = ts.values_;
    args_00.desc_ = in_stack_ffffffffffffff88;
    local_130 = local_a0;
    ::fmt::v11::detail::vformat_to<char>
              (in_stack_ffffffffffffff80,(text_style *)ts.values_,fmt_00,args_00);
  }
  return;
}

Assistant:

void format(const fmt::text_style& style, fmt::format_string<Args...> fmt, Args&&... args) {
        if (!showColors) {
            fmt::detail::vformat_to(buf, fmt::string_view(fmt), fmt::make_format_args(args...));
        }
        else {
            fmt::detail::vformat_to(buf, style, fmt::string_view(fmt),
                                    fmt::make_format_args(args...));
        }
    }